

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyline.cpp
# Opt level: O0

span<const_mpt::point<double>_> __thiscall mpt::polyline::part::points(part *this)

{
  point<double> *local_30;
  point *pts;
  size_t len;
  part *this_local;
  
  pts = (point *)(ulong)(this->_part).usr;
  local_30 = this->_pts;
  if ((this->_part)._cut != 0) {
    local_30 = local_30 + 1;
    pts = (point *)((long)&pts[-1].y + 7);
  }
  if ((this->_part)._trim != 0) {
    pts = (point *)((long)&pts[-1].y + 7);
  }
  span<const_mpt::point<double>_>::span
            ((span<const_mpt::point<double>_> *)&this_local,local_30,(long)pts);
  return _this_local;
}

Assistant:

span<const polyline::point> polyline::part::points() const
{
	size_t len = _part.usr;
	const point *pts = _pts;
	if (_part._cut) {
		++pts;
		--len;
	}
	if (_part._trim) {
		--len;
	}
	return span<const point>(pts, len);
}